

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

tool_mime * tool_mime_new_parts(tool_mime *parent)

{
  tool_mime *ptVar1;
  tool_mime *parent_local;
  
  ptVar1 = tool_mime_new(parent,TOOLMIME_PARTS);
  return ptVar1;
}

Assistant:

static struct tool_mime *tool_mime_new_parts(struct tool_mime *parent)
{
  return tool_mime_new(parent, TOOLMIME_PARTS);
}